

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_indexOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue JVar1;
  JSValue op2;
  ulong uVar2;
  int iVar3;
  BOOL BVar4;
  JSValueUnion JVar5;
  ulong uVar6;
  int64_t iVar8;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  uint uVar9;
  int64_t *piVar10;
  ulong idx;
  double dVar11;
  ulong uVar12;
  bool bVar13;
  JSValue JVar14;
  JSValue op2_00;
  JSValue val;
  int64_t len;
  ulong local_68;
  JSValueUnion local_60;
  ulong local_58;
  JSValueUnion local_50;
  int64_t local_48;
  ulong local_40;
  ulong local_38;
  JSValueUnion JVar7;
  
  JVar14 = JS_ToObject(ctx,this_val);
  JVar7 = (JSValueUnion)JVar14.tag;
  JVar5 = JVar14.u;
  iVar3 = js_get_length64(ctx,(int64_t *)&local_38,JVar14);
  uVar9 = (uint)JVar14.tag;
  if (iVar3 == 0) {
    if ((long)local_38 < 1) {
      uVar12 = 0xffffffffffffffff;
      uVar6 = local_68;
    }
    else {
      local_68 = 0;
      if (1 < argc) {
        JVar7 = (JSValueUnion)argv[1].tag;
        iVar3 = JS_ToInt64Clamp(ctx,(int64_t *)&local_68,argv[1],0,local_38,local_38);
        if (iVar3 != 0) goto LAB_001660d4;
      }
      bVar13 = true;
      if (((uVar9 == 0xffffffff) && (JVar7 = JVar5, *(short *)((long)JVar5.ptr + 6) == 2)) &&
         ((*(byte *)((long)JVar5.ptr + 5) & 8) != 0)) {
        local_58 = (ulong)*(uint *)((long)JVar5.ptr + 0x40);
        JVar7 = (JSValueUnion)((JSValueUnion *)((long)JVar5.ptr + 0x38))->ptr;
        bVar13 = false;
      }
      else {
        local_58 = 0;
      }
      uVar6 = local_68;
      local_50 = JVar5;
      if ((!bVar13) && ((long)local_68 < (long)local_58)) {
        local_40 = local_38;
        piVar10 = (int64_t *)((long)JVar7.ptr + local_68 * 0x10 + 8);
        uVar12 = local_68;
        do {
          JVar1 = *argv;
          if (0xfffffff4 < (uint)argv->tag) {
            *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
          }
          local_50 = (JSValueUnion)((JSValueUnion *)(piVar10 + -1))->ptr;
          iVar8 = *piVar10;
          if (0xfffffff4 < (uint)iVar8) {
            *(int *)local_50.ptr = *local_50.ptr + 1;
          }
          op2_00.tag = iVar8;
          op2_00.u.ptr = local_50.ptr;
          BVar4 = js_strict_eq2(ctx,JVar1,op2_00,JS_EQ_STRICT);
          uVar6 = uVar12;
          if (BVar4 != 0) goto LAB_001662b4;
          uVar12 = uVar12 + 1;
          piVar10 = piVar10 + 2;
          local_38 = local_40;
          uVar6 = local_58;
        } while (local_58 != uVar12);
      }
      local_68 = uVar6;
      uVar12 = 0xffffffffffffffff;
      idx = local_68;
      uVar6 = local_68;
      uVar2 = local_38;
      if ((long)local_68 < (long)local_38) {
        do {
          local_40 = uVar2;
          iVar3 = JS_TryGetPropertyInt64(ctx,JVar14,idx,(JSValue *)&local_50);
          iVar8 = extraout_RDX;
          if (iVar3 < 0) {
            iVar3 = 2;
          }
          else if (iVar3 == 0) {
            iVar3 = 0;
          }
          else {
            local_60 = (JSValueUnion)(argv->u).ptr;
            JVar1 = *argv;
            if (0xfffffff4 < (uint)argv->tag) {
              *(int *)local_60.ptr = *local_60.ptr + 1;
            }
            op2.tag = local_48;
            op2.u.float64 = local_50.float64;
            iVar3 = js_strict_eq2(ctx,JVar1,op2,JS_EQ_STRICT);
            iVar8 = extraout_RDX_00;
            if (iVar3 != 0) {
              iVar3 = 7;
              uVar12 = idx;
            }
          }
          if (iVar3 != 0) {
            local_68 = idx;
            if (iVar3 == 2) goto LAB_001660d4;
            uVar6 = idx;
            if (iVar3 != 7) {
              uVar12 = 0;
              uVar6 = 0;
              goto LAB_00166310;
            }
            break;
          }
          idx = idx + 1;
          uVar6 = local_40;
          uVar2 = local_40;
        } while (local_40 != idx);
      }
    }
LAB_001662b4:
    local_68 = uVar6;
    if ((0xfffffff4 < uVar9) && (iVar3 = *JVar5.ptr, *(int *)JVar5.ptr = iVar3 + -1, iVar3 < 2)) {
      local_60 = JVar5;
      __JS_FreeValueRT(ctx->rt,JVar14);
    }
    bVar13 = (long)(int)uVar12 == uVar12;
    dVar11 = (double)(long)uVar12;
    if (bVar13) {
      dVar11 = (double)(uVar12 & 0xffffffff);
    }
    iVar8 = 7;
    if (bVar13) {
      iVar8 = 0;
    }
    uVar6 = (ulong)dVar11 & 0xffffffff00000000;
    uVar12 = (ulong)dVar11 & 0xffffffff;
  }
  else {
LAB_001660d4:
    if ((0xfffffff4 < uVar9) && (iVar3 = *JVar5.ptr, *(int *)JVar5.ptr = iVar3 + -1, iVar3 < 2)) {
      local_60 = JVar5;
      __JS_FreeValueRT(ctx->rt,JVar14);
    }
    iVar8 = 6;
    uVar12 = 0;
    uVar6 = 0;
  }
LAB_00166310:
  JVar14.u.ptr = (void *)(uVar12 | uVar6);
  JVar14.tag = iVar8;
  return JVar14;
}

Assistant:

static JSValue js_array_indexOf(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue obj, val;
    int64_t len, n, res;
    JSValue *arrp;
    uint32_t count;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    res = -1;
    if (len > 0) {
        n = 0;
        if (argc > 1) {
            if (JS_ToInt64Clamp(ctx, &n, argv[1], 0, len, len))
                goto exception;
        }
        if (js_get_fast_array(ctx, obj, &arrp, &count)) {
            for (; n < count; n++) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]),
                                  JS_DupValue(ctx, arrp[n]), JS_EQ_STRICT)) {
                    res = n;
                    goto done;
                }
            }
        }
        for (; n < len; n++) {
            int present = JS_TryGetPropertyInt64(ctx, obj, n, &val);
            if (present < 0)
                goto exception;
            if (present) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]), val, JS_EQ_STRICT)) {
                    res = n;
                    break;
                }
            }
        }
    }
 done:
    JS_FreeValue(ctx, obj);
    return JS_NewInt64(ctx, res);

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}